

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_list::erase_peer(peer_list *this,iterator *i,torrent_state *state)

{
  torrent_peer **__src;
  pointer *ppptVar1;
  uint uVar2;
  iterator __position;
  _Map_pointer ppptVar3;
  _Map_pointer ppptVar4;
  int iVar5;
  torrent_peer *ptVar6;
  __normal_iterator<libtorrent::aux::torrent_peer_**,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
  __dest;
  long lVar7;
  _Elt_pointer pptVar8;
  torrent_peer **pptVar9;
  iterator local_50;
  iterator local_30;
  
  __position._M_current =
       (state->erased).
       super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->erased).
      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>::
    _M_realloc_insert<libtorrent::aux::torrent_peer*const&>
              ((vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>
                *)&state->erased,__position,i->_M_cur);
  }
  else {
    *__position._M_current = *i->_M_cur;
    ppptVar1 = &(state->erased).
                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  pptVar8 = i->_M_cur;
  ptVar6 = *pptVar8;
  if ((ptVar6->field_0x1b & 0x80) != 0) {
    *(uint *)&this->field_0x60 =
         *(uint *)&this->field_0x60 & 0x80000000 | *(uint *)&this->field_0x60 - 1 & 0x7fffffff;
    pptVar8 = i->_M_cur;
    ptVar6 = *pptVar8;
  }
  if ((((ptVar6->connection == (peer_connection_interface *)0x0) &&
       (uVar2 = *(uint *)&ptVar6->field_0x1b, (uVar2 & 0x88000020) == 0x20)) &&
      ((-1 < (char)uVar2 || (-1 < *(int *)&this->field_0x60)))) &&
     ((int)(uVar2 & 0x1f) < this->m_max_failcount)) {
    iVar5 = 1;
    if (1 < this->m_num_connect_candidates) {
      iVar5 = this->m_num_connect_candidates;
    }
    this->m_num_connect_candidates = iVar5 + -1;
    pptVar8 = i->_M_cur;
  }
  iVar5 = this->m_round_robin;
  ppptVar3 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar7 = (long)(this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last -
          (long)(this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3;
  if ((long)(((((ulong)((long)i->_M_node - (long)ppptVar3) >> 3) - 1) +
             (ulong)(i->_M_node == (_Map_pointer)0x0)) * 0x40 + lVar7 +
            ((long)pptVar8 - (long)i->_M_first >> 3)) < (long)iVar5) {
    iVar5 = iVar5 + -1;
    this->m_round_robin = iVar5;
  }
  ppptVar4 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if ((int)((int)lVar7 +
            (int)((ulong)((long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->m_peers).
                               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                               .
                               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
           ((((uint)((int)ppptVar4 - (int)ppptVar3) >> 3) - 1) +
           (uint)(ppptVar4 == (_Map_pointer)0x0)) * 0x40) <= iVar5) {
    this->m_round_robin = 0;
  }
  __dest = ::std::
           __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::torrent_peer**,std::vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::torrent_peer*const>>
                     ((this->m_candidate_cache).
                      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->m_candidate_cache).
                      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  pptVar9 = (this->m_candidate_cache).
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != pptVar9) {
    __src = __dest._M_current + 1;
    if (__src != pptVar9) {
      memmove(__dest._M_current,__src,(long)pptVar9 - (long)__src);
      pptVar9 = (this->m_candidate_cache).
                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->m_candidate_cache).
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = pptVar9 + -1;
  }
  (*this->m_peer_allocator->_vptr_torrent_peer_allocator_interface[1])
            (this->m_peer_allocator,*i->_M_cur);
  local_30._M_cur = i->_M_cur;
  local_30._M_node = i->_M_node;
  local_30._M_first = *local_30._M_node;
  local_30._M_last = local_30._M_first + 0x40;
  ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  _M_erase(&local_50,
           (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            *)this,&local_30);
  return;
}

Assistant:

void peer_list::erase_peer(iterator i, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;
		TORRENT_ASSERT(i != m_peers.end());
		TORRENT_ASSERT(m_locked_peer != *i);

		state->erased.push_back(*i);
		if ((*i)->seed)
		{
			TORRENT_ASSERT(m_num_seeds > 0);
			--m_num_seeds;
		}
		if (is_connect_candidate(**i))
			update_connect_candidates(-1);
		TORRENT_ASSERT(m_num_connect_candidates < int(m_peers.size()));
		if (m_round_robin > i - m_peers.begin()) --m_round_robin;
		if (m_round_robin >= int(m_peers.size())) m_round_robin = 0;

		// if this peer is in the connect candidate
		// cache, erase it from there as well
		auto const ci = std::find(m_candidate_cache.begin(), m_candidate_cache.end(), *i);
		if (ci != m_candidate_cache.end()) m_candidate_cache.erase(ci);

		m_peer_allocator.free_peer_entry(*i);
		m_peers.erase(i);
	}